

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O3

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits)

{
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var1;
  uint uVar2;
  int iVar3;
  _Head_base<0UL,_unsigned_int_*,_false> _Var4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  _Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  }
  if (uVar2 != bits) {
    if (bits == 0) {
      (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
      if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
        operator_delete__((void *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
        return;
      }
    }
    else {
      iVar8 = bits + 0x3e;
      if (-1 < bits + 0x1f) {
        iVar8 = bits + 0x1f;
      }
      iVar8 = iVar8 >> 5;
      if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar3 = *(uint *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x1f;
        iVar6 = *(uint *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x3e;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        iVar6 = iVar6 >> 5;
      }
      if (iVar8 == iVar6) {
        *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = bits;
        _Var4 = _Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      }
      else {
        uVar7 = 0xffffffffffffffff;
        if (-0x5f < bits) {
          uVar7 = (ulong)(iVar8 + 1) << 2;
        }
        _Var4._M_head_impl = (uint *)operator_new__(uVar7);
        *_Var4._M_head_impl = bits;
        if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
          iVar3 = iVar8;
          if (iVar6 < iVar8) {
            iVar3 = iVar6;
          }
          memcpy((uint *)((long)_Var4._M_head_impl + 4),
                 (uint *)((long)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4)
                 ,(long)(iVar3 << 2));
        }
        if (iVar8 - iVar6 != 0 && iVar6 <= iVar8) {
          memset((uint *)((long)_Var4._M_head_impl + (long)iVar6 * 4) + 1,0,
                 (long)((iVar8 - iVar6) * 4));
        }
        (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false> =
             (_Head_base<0UL,_unsigned_int_*,_false>)_Var4._M_head_impl;
        if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
          operator_delete__((void *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl)
          ;
          _Var4._M_head_impl =
               (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
               _M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
          if (_Var4._M_head_impl == (uint *)0x0) {
            return;
          }
        }
      }
      uVar2 = *_Var4._M_head_impl;
      if ((uVar2 & 0x1f) != 0) {
        uVar5 = -1 << (-(char)(uVar2 & 0x1f) & 0x1fU);
        iVar8 = uVar2 + 0x3e;
        if (-1 < (int)(uVar2 + 0x1f)) {
          iVar8 = uVar2 + 0x1f;
        }
        _Var4._M_head_impl[iVar8 >> 5] =
             _Var4._M_head_impl[iVar8 >> 5] &
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
      }
    }
  }
  return;
}

Assistant:

void bitfield::resize(int const bits)
	{
		if (bits == size()) return;

		TORRENT_ASSERT(bits >= 0);
		if (bits == 0)
		{
			m_buf.reset();
			return;
		}
		int const new_size_words = (bits + 31) / 32;
		int const cur_size_words = num_words();
		if (cur_size_words != new_size_words)
		{
			aux::unique_ptr<std::uint32_t[]> b(new std::uint32_t[std::size_t(new_size_words + 1)]);
#ifdef BOOST_NO_EXCEPTIONS
			if (b == nullptr) std::terminate();
#endif
			b[0] = aux::numeric_cast<std::uint32_t>(bits);
			if (m_buf) std::memcpy(&b[1], buf()
				, aux::numeric_cast<std::size_t>(std::min(new_size_words, cur_size_words) * 4));
			if (new_size_words > cur_size_words)
			{
				std::memset(&b[1 + cur_size_words], 0
					, aux::numeric_cast<std::size_t>((new_size_words - cur_size_words) * 4));
			}
			m_buf = std::move(b);
		}
		else
		{
			m_buf[0] = aux::numeric_cast<std::uint32_t>(bits);
		}

		clear_trailing_bits();
		TORRENT_ASSERT(size() == bits);
	}